

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O1

void __thiscall cmFindCommon::InitializeSearchPathGroups(cmFindCommon *this)

{
  map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  mapped_type *this_01;
  cmSearchPath cStack_88;
  pair<cmFindCommon::PathLabel,_cmSearchPath> local_68;
  
  this_01 = std::
            map<cmFindCommon::PathGroup,_std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>,_std::less<cmFindCommon::PathGroup>,_std::allocator<std::pair<const_cmFindCommon::PathGroup,_std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>_>_>_>
            ::operator[](&this->PathGroupLabelMap,&PathGroup::All);
  std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>::push_back
            (this_01,&PathLabel::PackageRoot);
  std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>::push_back
            (this_01,&PathLabel::CMake);
  std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>::push_back
            (this_01,&PathLabel::CMakeEnvironment);
  std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>::push_back
            (this_01,&PathLabel::Hints);
  std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>::push_back
            (this_01,&PathLabel::SystemEnvironment);
  std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>::push_back
            (this_01,&PathLabel::CMakeSystem);
  std::vector<cmFindCommon::PathLabel,_std::allocator<cmFindCommon::PathLabel>_>::push_back
            (this_01,&PathLabel::Guess);
  std::vector<cmFindCommon::PathGroup,_std::allocator<cmFindCommon::PathGroup>_>::push_back
            (&this->PathGroupOrder,&PathGroup::All);
  cmSearchPath::cmSearchPath(&cStack_88,this);
  std::pair<cmFindCommon::PathLabel,_cmSearchPath>::
  pair<cmFindCommon::PathLabel_&,_cmSearchPath,_true>(&local_68,&PathLabel::PackageRoot,&cStack_88);
  this_00 = &this->LabeledPaths;
  std::
  _Rb_tree<cmFindCommon::PathLabel,std::pair<cmFindCommon::PathLabel_const,cmSearchPath>,std::_Select1st<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
  ::_M_emplace_unique<std::pair<cmFindCommon::PathLabel,cmSearchPath>>
            ((_Rb_tree<cmFindCommon::PathLabel,std::pair<cmFindCommon::PathLabel_const,cmSearchPath>,std::_Select1st<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
              *)this_00,&local_68);
  cmSearchPath::~cmSearchPath(&local_68.second);
  paVar1 = &local_68.first.super_cmPathLabel.Label.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first.super_cmPathLabel.Label._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first.super_cmPathLabel.Label._M_dataplus._M_p,
                    local_68.first.super_cmPathLabel.Label.field_2._M_allocated_capacity + 1);
  }
  cmSearchPath::~cmSearchPath(&cStack_88);
  cmSearchPath::cmSearchPath(&cStack_88,this);
  std::pair<cmFindCommon::PathLabel,_cmSearchPath>::
  pair<cmFindCommon::PathLabel_&,_cmSearchPath,_true>(&local_68,&PathLabel::CMake,&cStack_88);
  std::
  _Rb_tree<cmFindCommon::PathLabel,std::pair<cmFindCommon::PathLabel_const,cmSearchPath>,std::_Select1st<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
  ::_M_emplace_unique<std::pair<cmFindCommon::PathLabel,cmSearchPath>>
            ((_Rb_tree<cmFindCommon::PathLabel,std::pair<cmFindCommon::PathLabel_const,cmSearchPath>,std::_Select1st<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
              *)this_00,&local_68);
  cmSearchPath::~cmSearchPath(&local_68.second);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first.super_cmPathLabel.Label._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first.super_cmPathLabel.Label._M_dataplus._M_p,
                    local_68.first.super_cmPathLabel.Label.field_2._M_allocated_capacity + 1);
  }
  cmSearchPath::~cmSearchPath(&cStack_88);
  cmSearchPath::cmSearchPath(&cStack_88,this);
  std::pair<cmFindCommon::PathLabel,_cmSearchPath>::
  pair<cmFindCommon::PathLabel_&,_cmSearchPath,_true>
            (&local_68,&PathLabel::CMakeEnvironment,&cStack_88);
  std::
  _Rb_tree<cmFindCommon::PathLabel,std::pair<cmFindCommon::PathLabel_const,cmSearchPath>,std::_Select1st<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
  ::_M_emplace_unique<std::pair<cmFindCommon::PathLabel,cmSearchPath>>
            ((_Rb_tree<cmFindCommon::PathLabel,std::pair<cmFindCommon::PathLabel_const,cmSearchPath>,std::_Select1st<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
              *)this_00,&local_68);
  cmSearchPath::~cmSearchPath(&local_68.second);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first.super_cmPathLabel.Label._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first.super_cmPathLabel.Label._M_dataplus._M_p,
                    local_68.first.super_cmPathLabel.Label.field_2._M_allocated_capacity + 1);
  }
  cmSearchPath::~cmSearchPath(&cStack_88);
  cmSearchPath::cmSearchPath(&cStack_88,this);
  std::pair<cmFindCommon::PathLabel,_cmSearchPath>::
  pair<cmFindCommon::PathLabel_&,_cmSearchPath,_true>(&local_68,&PathLabel::Hints,&cStack_88);
  std::
  _Rb_tree<cmFindCommon::PathLabel,std::pair<cmFindCommon::PathLabel_const,cmSearchPath>,std::_Select1st<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
  ::_M_emplace_unique<std::pair<cmFindCommon::PathLabel,cmSearchPath>>
            ((_Rb_tree<cmFindCommon::PathLabel,std::pair<cmFindCommon::PathLabel_const,cmSearchPath>,std::_Select1st<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
              *)this_00,&local_68);
  cmSearchPath::~cmSearchPath(&local_68.second);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first.super_cmPathLabel.Label._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first.super_cmPathLabel.Label._M_dataplus._M_p,
                    local_68.first.super_cmPathLabel.Label.field_2._M_allocated_capacity + 1);
  }
  cmSearchPath::~cmSearchPath(&cStack_88);
  cmSearchPath::cmSearchPath(&cStack_88,this);
  std::pair<cmFindCommon::PathLabel,_cmSearchPath>::
  pair<cmFindCommon::PathLabel_&,_cmSearchPath,_true>
            (&local_68,&PathLabel::SystemEnvironment,&cStack_88);
  std::
  _Rb_tree<cmFindCommon::PathLabel,std::pair<cmFindCommon::PathLabel_const,cmSearchPath>,std::_Select1st<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
  ::_M_emplace_unique<std::pair<cmFindCommon::PathLabel,cmSearchPath>>
            ((_Rb_tree<cmFindCommon::PathLabel,std::pair<cmFindCommon::PathLabel_const,cmSearchPath>,std::_Select1st<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
              *)this_00,&local_68);
  cmSearchPath::~cmSearchPath(&local_68.second);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first.super_cmPathLabel.Label._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first.super_cmPathLabel.Label._M_dataplus._M_p,
                    local_68.first.super_cmPathLabel.Label.field_2._M_allocated_capacity + 1);
  }
  cmSearchPath::~cmSearchPath(&cStack_88);
  cmSearchPath::cmSearchPath(&cStack_88,this);
  std::pair<cmFindCommon::PathLabel,_cmSearchPath>::
  pair<cmFindCommon::PathLabel_&,_cmSearchPath,_true>(&local_68,&PathLabel::CMakeSystem,&cStack_88);
  std::
  _Rb_tree<cmFindCommon::PathLabel,std::pair<cmFindCommon::PathLabel_const,cmSearchPath>,std::_Select1st<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
  ::_M_emplace_unique<std::pair<cmFindCommon::PathLabel,cmSearchPath>>
            ((_Rb_tree<cmFindCommon::PathLabel,std::pair<cmFindCommon::PathLabel_const,cmSearchPath>,std::_Select1st<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
              *)this_00,&local_68);
  cmSearchPath::~cmSearchPath(&local_68.second);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first.super_cmPathLabel.Label._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first.super_cmPathLabel.Label._M_dataplus._M_p,
                    local_68.first.super_cmPathLabel.Label.field_2._M_allocated_capacity + 1);
  }
  cmSearchPath::~cmSearchPath(&cStack_88);
  cmSearchPath::cmSearchPath(&cStack_88,this);
  std::pair<cmFindCommon::PathLabel,_cmSearchPath>::
  pair<cmFindCommon::PathLabel_&,_cmSearchPath,_true>(&local_68,&PathLabel::Guess,&cStack_88);
  std::
  _Rb_tree<cmFindCommon::PathLabel,std::pair<cmFindCommon::PathLabel_const,cmSearchPath>,std::_Select1st<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
  ::_M_emplace_unique<std::pair<cmFindCommon::PathLabel,cmSearchPath>>
            ((_Rb_tree<cmFindCommon::PathLabel,std::pair<cmFindCommon::PathLabel_const,cmSearchPath>,std::_Select1st<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>,std::less<cmFindCommon::PathLabel>,std::allocator<std::pair<cmFindCommon::PathLabel_const,cmSearchPath>>>
              *)this_00,&local_68);
  cmSearchPath::~cmSearchPath(&local_68.second);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first.super_cmPathLabel.Label._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first.super_cmPathLabel.Label._M_dataplus._M_p,
                    local_68.first.super_cmPathLabel.Label.field_2._M_allocated_capacity + 1);
  }
  cmSearchPath::~cmSearchPath(&cStack_88);
  return;
}

Assistant:

void cmFindCommon::InitializeSearchPathGroups()
{
  std::vector<PathLabel>* labels;

  // Define the various different groups of path types

  // All search paths
  labels = &this->PathGroupLabelMap[PathGroup::All];
  labels->push_back(PathLabel::PackageRoot);
  labels->push_back(PathLabel::CMake);
  labels->push_back(PathLabel::CMakeEnvironment);
  labels->push_back(PathLabel::Hints);
  labels->push_back(PathLabel::SystemEnvironment);
  labels->push_back(PathLabel::CMakeSystem);
  labels->push_back(PathLabel::Guess);

  // Define the search group order
  this->PathGroupOrder.push_back(PathGroup::All);

  // Create the individual labeled search paths
  this->LabeledPaths.insert(
    std::make_pair(PathLabel::PackageRoot, cmSearchPath(this)));
  this->LabeledPaths.insert(
    std::make_pair(PathLabel::CMake, cmSearchPath(this)));
  this->LabeledPaths.insert(
    std::make_pair(PathLabel::CMakeEnvironment, cmSearchPath(this)));
  this->LabeledPaths.insert(
    std::make_pair(PathLabel::Hints, cmSearchPath(this)));
  this->LabeledPaths.insert(
    std::make_pair(PathLabel::SystemEnvironment, cmSearchPath(this)));
  this->LabeledPaths.insert(
    std::make_pair(PathLabel::CMakeSystem, cmSearchPath(this)));
  this->LabeledPaths.insert(
    std::make_pair(PathLabel::Guess, cmSearchPath(this)));
}